

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O3

Formula * __thiscall
Kernel::FormulaTransformer::applyQuantified(FormulaTransformer *this,Formula *f)

{
  pointer pcVar1;
  Connective CVar2;
  undefined4 uVar3;
  Formula *pFVar4;
  Formula *pFVar5;
  void **head;
  
  pFVar4 = apply(this,(Formula *)f[1]._label._M_string_length);
  if (pFVar4 != (Formula *)f[1]._label._M_string_length) {
    pFVar5 = (Formula *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    CVar2 = f[1]._connective;
    uVar3 = *(undefined4 *)&f[1].field_0x4;
    pcVar1 = f[1]._label._M_dataplus._M_p;
    pFVar5->_connective = f->_connective;
    (pFVar5->_label)._M_dataplus._M_p = (pointer)&(pFVar5->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar5->_label,Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Formula::DEFAULT_LABEL_abi_cxx11_);
    pFVar5[1]._connective = CVar2;
    *(undefined4 *)&pFVar5[1].field_0x4 = uVar3;
    pFVar5[1]._label._M_dataplus._M_p = pcVar1;
    pFVar5[1]._label._M_string_length = (size_type)pFVar4;
    f = pFVar5;
  }
  return f;
}

Assistant:

Formula* FormulaTransformer::applyQuantified(Formula* f)
{
  Formula* newArg = apply(f->qarg());
  if(newArg==f->qarg()) {
    return f;
  }
  // 0 is for the sorts list
  return new QuantifiedFormula(f->connective(), f->vars(),f->sorts(), newArg);
}